

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftedMieBondType.hpp
# Opt level: O3

void __thiscall
OpenMD::ShiftedMieBondType::calcForce
          (ShiftedMieBondType *this,RealType r,RealType *V,RealType *dVdr)

{
  double dVar1;
  double dVar2;
  double __x;
  
  __x = 1.0 / (r / this->sigma);
  dVar1 = pow(__x,(double)this->n);
  dVar2 = pow(__x,(double)this->m);
  *V = (dVar1 - dVar2) * this->nmScale_ * this->epsilon - this->potS_;
  *dVdr = (((double)this->m * __x * dVar2 + (double)-this->n * dVar1 * __x) *
          this->nmScale_ * this->epsilon) / this->sigma;
  return;
}

Assistant:

virtual void calcForce(RealType r, RealType& V, RealType& dVdr) {
      RealType ros, ri, rin, rim, rin1, rim1;

      ros  = r / sigma;
      ri   = 1.0 / ros;
      rin  = pow(ri, n);
      rim  = pow(ri, m);
      rin1 = rin * ri;
      rim1 = rim * ri;

      V    = nmScale_ * epsilon * (rin - rim) - potS_;
      dVdr = nmScale_ * epsilon * (-n * rin1 + m * rim1) / sigma;
    }